

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

variables_map * validate_args(int ac,char **av)

{
  char *pcVar1;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar2;
  typed_value<unsigned_short,_char> *ptVar3;
  typed_value<long,_char> *ptVar4;
  typed_value<int,_char> *ptVar5;
  size_type sVar6;
  ostream *poVar7;
  void *this;
  char **in_RDX;
  undefined4 in_register_0000003c;
  variables_map *this_00;
  error *e;
  key_type local_158;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_138;
  basic_parsed_options<char> local_118;
  undefined1 local_ed;
  int local_ec;
  long local_e8;
  undefined8 local_e0 [3];
  allocator<char> local_c1;
  string local_c0 [32];
  options_description local_a0 [8];
  options_description desc;
  char **av_local;
  int ac_local;
  variables_map *vm;
  
  this_00 = (variables_map *)CONCAT44(in_register_0000003c,ac);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c0,"Allowed options",&local_c1);
  boost::program_options::options_description::options_description
            (local_a0,local_c0,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  local_e0[0] = boost::program_options::options_description::add_options();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_e0,"help,h");
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  ptVar2 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::required(ptVar2);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"mcast,g",(char *)ptVar2);
  ptVar3 = boost::program_options::value<unsigned_short>();
  ptVar3 = boost::program_options::typed_value<unsigned_short,_char>::required(ptVar3);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"udp-port,p",(char *)ptVar3);
  ptVar4 = boost::program_options::value<long>();
  local_e8 = 0x3200000;
  ptVar4 = boost::program_options::typed_value<long,_char>::default_value(ptVar4,&local_e8);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"max-space,b",(char *)ptVar4);
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  ptVar2 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::required(ptVar2);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"shared-folder,f",(char *)ptVar2);
  ptVar5 = boost::program_options::value<int>();
  local_ec = 5;
  ptVar5 = boost::program_options::typed_value<int,_char>::default_value(ptVar5,&local_ec);
  boost::program_options::options_description_easy_init::operator()
            (pcVar1,(value_semantic *)"timeout,t",(char *)ptVar5);
  local_ed = 0;
  boost::program_options::variables_map::variables_map(this_00);
  local_138.super_function_base.functor._8_8_ = 0;
  local_138.super_function_base.functor._16_8_ = 0;
  local_138.super_function_base.vtable = (vtable_base *)0x0;
  local_138.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function1(&local_138);
  boost::program_options::parse_command_line<char>(&local_118,(int)av,in_RDX,local_a0,0,&local_138);
  boost::program_options::store((basic_parsed_options *)&local_118,this_00,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options(&local_118);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_138);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"help",(allocator<char> *)((long)&e + 7));
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)(this_00 + 0x10),&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  if (sVar6 == 0) {
    boost::program_options::notify(this_00);
    local_ed = 1;
    boost::program_options::options_description::~options_description(local_a0);
    return this_00;
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"File store server");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  this = (void *)boost::program_options::operator<<(poVar7,local_a0);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  exit(0);
}

Assistant:

po::variables_map validate_args(int ac, char **av) {
  boost::program_options::options_description desc("Allowed options");
  desc.add_options()
      ("help,h", "Help")
      ("mcast,g", po::value<std::string>()->required(), "Multicast address")
      ("udp-port,p", po::value<uint16_t>()->required(), "UDP port")
      ("max-space,b", po::value<long>()->default_value(52428800), "Max space in folder")
      ("shared-folder,f", po::value<std::string>()->required(), "Shared folder")
      ("timeout,t", po::value<int>()->default_value(5), "Wait timeout");
  po::variables_map vm;
  try {
    po::store(po::parse_command_line(ac, av, desc), vm);
    if (vm.count("help")) {
      std::cout << "File store server" << std::endl
                << desc << std::endl;
      exit(0);
    }
    po::notify(vm);
  } catch (po::error &e) {
    std::cerr << "ERROR: " << e.what() << std::endl << std::endl;
    std::cerr << desc << std::endl;
    exit(1);
  }
  return vm;
}